

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

uint8_t * __thiscall
BufferedReader::readBlock
          (BufferedReader *this,int readerID,uint32_t *readCnt,int *rez,bool *firstBlockVar)

{
  byte bVar1;
  bool bVar2;
  pointer ppVar3;
  uint32_t local_a0;
  byte local_99;
  undefined1 local_80 [7];
  uint8_t prevIndex;
  unique_lock<std::mutex> lk;
  _Self local_68 [3];
  _Self local_50;
  iterator itr;
  lock_guard<std::mutex> lock;
  ReaderData *data;
  bool *firstBlockVar_local;
  int *rez_local;
  uint32_t *readCnt_local;
  BufferedReader *pBStack_18;
  int readerID_local;
  BufferedReader *this_local;
  
  readCnt_local._4_4_ = readerID;
  pBStack_18 = this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->m_readersMtx);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::find(&this->m_readers,(key_type_conflict *)((long)&readCnt_local + 4));
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::end(&this->m_readers);
  bVar2 = std::operator!=(&local_50,local_68);
  if (bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_50);
    lock._M_device = (mutex_type *)ppVar3->second;
    if ((((ReaderData *)lock._M_device)->m_nextBlockSize == 0) &&
       ((((ReaderData *)lock._M_device)->m_notified & 1U) == 0)) {
      ((ReaderData *)lock._M_device)->m_notified = true;
      ((ReaderData *)lock._M_device)->m_atQueue = ((ReaderData *)lock._M_device)->m_atQueue + 1;
      SafeQueueWithNotification<int>::push
                (&(this->m_readQueue).super_SafeQueueWithNotification<int>,
                 (int *)((long)&readCnt_local + 4));
    }
    lk._12_4_ = 0;
  }
  else {
    *rez = 3;
    *readCnt = 0;
    this_local = (BufferedReader *)0x0;
    lk._12_4_ = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  if (lk._12_4_ == 0) {
    if (((lock._M_device)->super___mutex_base)._M_mutex.__data.__nusers == 0) {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)local_80,&this->m_readMtx);
      while( true ) {
        local_99 = 0;
        if (((lock._M_device)->super___mutex_base)._M_mutex.__data.__nusers == 0) {
          local_99 = ((lock._M_device)->super___mutex_base)._M_mutex.__size[0x13] ^ 0xff;
        }
        if ((local_99 & 1) == 0) break;
        std::condition_variable::wait((unique_lock *)&this->m_readCond);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
    }
    if ((int)((lock._M_device)->super___mutex_base)._M_mutex.__data.__nusers < 0) {
      local_a0 = 0;
    }
    else {
      local_a0 = ((lock._M_device)->super___mutex_base)._M_mutex.__data.__nusers;
    }
    *readCnt = local_a0;
    *rez = (uint)((((lock._M_device)->super___mutex_base)._M_mutex.__size[0x13] & 1U) != 0);
    bVar1 = ((lock._M_device)->super___mutex_base)._M_mutex.__size[8];
    ((lock._M_device)->super___mutex_base)._M_mutex.__size[8] =
         '\x01' - ((lock._M_device)->super___mutex_base)._M_mutex.__size[8];
    ((lock._M_device)->super___mutex_base)._M_mutex.__data.__nusers = 0;
    ((lock._M_device)->super___mutex_base)._M_mutex.__size[9] = '\0';
    if (firstBlockVar != (bool *)0x0) {
      *firstBlockVar = (bool)(((lock._M_device)->super___mutex_base)._M_mutex.__size[0x11] & 1);
    }
    this_local = *(BufferedReader **)
                  ((long)&((lock._M_device)->super___mutex_base)._M_mutex + (ulong)bVar1 * 8 + 0x20)
    ;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* BufferedReader::readBlock(const int readerID, uint32_t& readCnt, int& rez, bool* firstBlockVar)
{
    ReaderData* data;
    {
        std::lock_guard lock(m_readersMtx);
        const auto itr = m_readers.find(readerID);
        if (itr != m_readers.end())
        {
            data = itr->second;
            if (!data->m_nextBlockSize && !data->m_notified)
            {  // No fragments of this block found, and no requests for reading this block
                data->m_notified = true;
                data->m_atQueue++;
                m_readQueue.push(readerID);
            }
        }
        else
        {
            rez = UNKNOWN_READERID;
            readCnt = 0;
            return nullptr;
        }
    }

    if (!data->m_nextBlockSize)
    {
        std::unique_lock lk(m_readMtx);
        while (data->m_nextBlockSize == 0 && !data->m_eof) m_readCond.wait(lk);
    }
    readCnt = data->m_nextBlockSize >= 0 ? data->m_nextBlockSize : 0;
    rez = data->m_eof ? DATA_EOF : NO_ERROR;
    const uint8_t prevIndex = data->m_bufferIndex;
    data->m_bufferIndex = 1 - data->m_bufferIndex;
    data->m_nextBlockSize = 0;
    data->m_notified = false;
    if (firstBlockVar)
        *firstBlockVar = data->m_firstBlock;
    return data->m_nextBlock[prevIndex];
}